

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory_unix.cpp
# Opt level: O1

string * extractFileDir(string *__return_storage_ptr__,string *fileName)

{
  long lVar1;
  
  lVar1 = std::__cxx11::string::rfind((char)fileName,0x2f);
  if (lVar1 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)fileName);
  }
  return __return_storage_ptr__;
}

Assistant:

string extractFileDir(const string& fileName)
{
    size_t index = fileName.find_last_of('/');
    if (index != string::npos)
        return fileName.substr(0, index + 1);
    return "";
}